

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O2

void __thiscall
Clasp::Asp::PrgDepGraph::addSccs
          (PrgDepGraph *this,LogicProgram *prg,AtomList *sccAtoms,NonHcfSet *nonHcfs)

{
  BodyVec *this_00;
  uint uVar1;
  PrgAtom *a;
  PrgNode PVar2;
  pointer pPVar3;
  PrgBody *pPVar4;
  pointer pBVar5;
  pointer pLVar6;
  pointer ppNVar7;
  pointer puVar8;
  size_type numPreds;
  bool bVar9;
  uint32 uVar10;
  uint uVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NonHcfStats *pNVar13;
  long lVar14;
  SharedContext *pSVar15;
  PrgDepGraph *this_01;
  uint uVar16;
  uint prop;
  ulong uVar17;
  PrgAtom *pPVar18;
  ulong uVar19;
  NodeId bId;
  PrgAtom *local_a0;
  SharedContext *local_98;
  PrgDepGraph *local_90;
  VarVec adj;
  VarVec ext;
  uint32 local_44;
  ulong local_40;
  ulong local_38;
  
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  ::reserve(&this->atoms_,(sccAtoms->ebo_).size + (this->atoms_).ebo_.size);
  pSVar15 = (prg->super_ProgramBuilder).ctx_;
  local_a0 = (PrgAtom *)(ulong)(sccAtoms->ebo_).size;
  uVar16 = 0;
  local_98 = pSVar15;
  local_90 = this;
  for (pPVar18 = (PrgAtom *)0x0; this_01 = local_90, local_a0 != pPVar18;
      pPVar18 = (PrgAtom *)&(pPVar18->super_PrgHead).super_PrgNode.field_0x1) {
    a = (sccAtoms->ebo_).buf[(long)pPVar18];
    bVar9 = relevantPrgAtom(local_90,*(pSVar15->solvers_).ebo_.buf,a);
    if (bVar9) {
      uVar10 = createAtom(this_01,(Literal)(*(int *)&(a->super_PrgHead).super_PrgNode * 2),
                          *(uint *)&(a->super_PrgHead).field_0x18 & 0x7ffffff);
      PVar2 = (a->super_PrgHead).super_PrgNode;
      (a->super_PrgHead).super_PrgNode =
           (PrgNode)((ulong)PVar2 & 0x30000000ffffffff | (ulong)(uVar10 & 0xfffffff) << 0x20 |
                    0x8000000000000000);
      SharedContext::setFrozen(pSVar15,(uint)((ulong)PVar2 >> 1) & 0x3fffffff,true);
      uVar16 = uVar16 + (a->super_PrgHead).supports_.ebo_.size;
    }
  }
  adj.ebo_.buf = (pointer)0x0;
  adj.ebo_.size = 0;
  adj.ebo_.cap = 0;
  ext.ebo_.buf = (pointer)0x0;
  ext.ebo_.size = 0;
  ext.ebo_.cap = 0;
  this_00 = &local_90->bodies_;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
  ::reserve(this_00,(uVar16 >> 1) + (local_90->bodies_).ebo_.size);
  uVar17 = (ulong)(sccAtoms->ebo_).size;
  uVar19 = 0;
  pSVar15 = local_98;
  local_40 = uVar17;
  do {
    if (uVar19 == uVar17) {
      if (((((nonHcfs->super_type).ebo_.size != 0) && (this_01->stats_ == (NonHcfStats *)0x0)) &&
          (nonHcfs->config != (Configuration *)0x0)) &&
         (iVar12 = (*nonHcfs->config->_vptr_Configuration[3])(),
         (*(byte *)(CONCAT44(extraout_var,iVar12) + 8) & 0x18) != 0)) {
        iVar12 = (*nonHcfs->config->_vptr_Configuration[3])();
        pNVar13 = enableNonHcfStats(this_01,*(uint *)(CONCAT44(extraout_var_00,iVar12) + 8) >> 3 & 3
                                    ,prg->incData_ != (Incremental *)0x0);
        this_01->stats_ = pNVar13;
      }
      ppNVar7 = (this_01->components_).ebo_.buf;
      uVar16 = (this_01->components_).ebo_.size;
      for (lVar14 = 0; (ulong)uVar16 << 3 != lVar14; lVar14 = lVar14 + 8) {
        NonHcfComponent::update(*(NonHcfComponent **)((long)ppNVar7 + lVar14),local_98);
      }
      uVar17 = (ulong)(*(uint *)&this_01->field_0x38 & 0x7fffffff);
      puVar8 = (nonHcfs->super_type).ebo_.buf;
      for (lVar14 = (ulong)(nonHcfs->super_type).ebo_.size * 4 + uVar17 * -4; lVar14 != 0;
          lVar14 = lVar14 + -4) {
        addNonHcf(this_01,(uint32)uVar17,local_98,nonHcfs->config,puVar8[uVar17]);
        uVar17 = uVar17 + 1;
      }
      *(uint *)&this_01->field_0x38 =
           *(uint *)&this_01->field_0x38 & 0x80000000 | (nonHcfs->super_type).ebo_.size & 0x7fffffff
      ;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::ebo::~ebo(&ext.ebo_);
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::ebo::~ebo(&adj.ebo_);
      return;
    }
    local_a0 = (sccAtoms->ebo_).buf[uVar19];
    bVar9 = relevantPrgAtom(this_01,*(pSVar15->solvers_).ebo_.buf,local_a0);
    if (bVar9) {
      pPVar3 = (local_a0->super_PrgHead).supports_.ebo_.buf;
      uVar16 = (local_a0->super_PrgHead).supports_.ebo_.size;
      prop = 0;
      local_38 = uVar19;
      for (lVar14 = 0; (ulong)uVar16 << 2 != lVar14; lVar14 = lVar14 + 4) {
        bId = 0xfffffff;
        uVar11 = *(uint *)((long)&pPVar3->rep + lVar14);
        if ((uVar11 & 0xc) == 8) {
          uVar11 = addDisj(local_90,prg,(prg->disjunctions_).ebo_.buf[uVar11 >> 4]);
          prop = prop | 2;
LAB_0012df0e:
          bId = uVar11;
          if (uVar11 != 0xfffffff) {
            pBVar5 = (this_00->ebo_).buf;
            uVar1 = *(uint *)&pBVar5[uVar11].super_Node.field_0x4;
            if (-1 < (int)uVar1) {
              *(uint *)&pBVar5[uVar11].super_Node.field_0x4 = uVar1 | 0x80000000;
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&adj,&bId);
            }
            prop = prop | *(uint *)((long)&pPVar3->rep + lVar14) >> 1 & 1;
          }
        }
        else if (((uVar11 & 0xc) == 4) && ((uVar11 & 1) == 0)) {
          pPVar4 = (prg->bodies_).ebo_.buf[uVar11 >> 4];
          bVar9 = relevantPrgBody(local_90,*(local_98->solvers_).ebo_.buf,pPVar4);
          uVar11 = 0xfffffff;
          if (bVar9) {
            uVar11 = addBody(local_90,prg,pPVar4);
          }
          goto LAB_0012df0e;
        }
      }
      numPreds = adj.ebo_.size;
      pLVar6 = (local_a0->deps_).ebo_.buf;
      uVar16 = (local_a0->deps_).ebo_.size;
      for (lVar14 = 0; this_01 = local_90, (ulong)uVar16 << 2 != lVar14; lVar14 = lVar14 + 4) {
        uVar11 = *(uint *)((long)&pLVar6->rep_ + lVar14);
        if ((uVar11 & 2) == 0) {
          pPVar4 = (prg->bodies_).ebo_.buf[uVar11 >> 2];
          bVar9 = relevantPrgBody(local_90,*(local_98->solvers_).ebo_.buf,pPVar4);
          if ((bVar9) &&
             (uVar10 = PrgBody::scc(pPVar4,prg),
             uVar10 == (*(uint *)&(local_a0->super_PrgHead).field_0x18 & 0x7ffffff))) {
            bId = addBody(local_90,prg,pPVar4);
            if (((this_00->ebo_).buf[bId].super_Node.field_0x7 & 0x10) == 0) {
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&adj,&bId);
            }
            else {
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&ext,&bId);
              local_44 = BodyNode::get_pred_idx
                                   ((this_00->ebo_).buf + bId,
                                    *(uint *)&(local_a0->super_PrgHead).super_PrgNode.field_0x4 &
                                    0xfffffff);
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&ext,&local_44);
              prop = prop | 4;
            }
          }
        }
      }
      if (ext.ebo_.size != 0) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&adj,&Potassco::idMax)
        ;
        bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::insert_range<unsigned_int*>
                  ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)&adj,
                   adj.ebo_.buf + (adj.ebo_._8_8_ & 0xffffffff),ext.ebo_.buf,
                   ext.ebo_.buf + (ext.ebo_._8_8_ & 0xffffffff),0);
      }
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&adj,&Potassco::idMax);
      initAtom(this_01,*(uint *)&(local_a0->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff,prop,
               &adj,numPreds);
      adj.ebo_._8_8_ = adj.ebo_._8_8_ & 0xffffffff00000000;
      ext.ebo_._8_8_ = ext.ebo_._8_8_ & 0xffffffff00000000;
      pSVar15 = local_98;
      uVar17 = local_40;
      uVar19 = local_38;
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void PrgDepGraph::addSccs(LogicProgram& prg, const AtomList& sccAtoms, const NonHcfSet& nonHcfs) {
	// Pass 1: Create graph atom nodes and estimate number of bodies
	atoms_.reserve(atoms_.size() + sccAtoms.size());
	AtomList::size_type numBodies = 0;
	SharedContext& ctx = *prg.ctx();
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom* a = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			// add graph atom node and store link between program node and graph node for later lookup
			a->resetId(createAtom(a->literal(), a->scc()), true);
			// atom is defined by more than just a bunch of clauses
			ctx.setFrozen(a->var(), true);
			numBodies += a->supports();
		}
	}
	// Pass 2: Init atom nodes and create body nodes
	VarVec adj, ext;
	bodies_.reserve(bodies_.size() + numBodies/2);
	PrgBody* prgBody; PrgDisj* prgDis;
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom*   a  = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			uint32 prop = 0;
			for (PrgAtom::sup_iterator it = a->supps_begin(), endIt = a->supps_end(); it != endIt; ++it) {
				assert(it->isBody() || it->isDisj());
				NodeId bId= PrgNode::noNode;
				if (it->isBody() && !it->isGamma()) {
					prgBody = prg.getBody(it->node());
					bId     = relevantPrgBody(*ctx.master(), prgBody) ? addBody(prg, prgBody) : PrgNode::noNode;
				}
				else if (it->isDisj()) {
					prgDis  = prg.getDisj(it->node());
					bId     = addDisj(prg, prgDis);
					prop   |= AtomNode::property_in_disj;
				}
				if (bId != PrgNode::noNode) {
					if (!bodies_[bId].seen()) {
						bodies_[bId].seen(true);
						adj.push_back(bId);
					}
					if (it->isChoice()) {
						// mark atom as in choice
						prop |= AtomNode::property_in_choice;
					}
				}
			}
			uint32 nPred= (uint32)adj.size();
			for (PrgAtom::dep_iterator it = a->deps_begin(), endIt = a->deps_end(); it != endIt; ++it) {
				if (!it->sign()) {
					prgBody = prg.getBody(it->var());
					if (relevantPrgBody(*ctx.master(), prgBody) && prgBody->scc(prg) == a->scc()) {
						NodeId bodyId = addBody(prg, prgBody);
						if (!bodies_[bodyId].extended()) {
							adj.push_back(bodyId);
						}
						else {
							ext.push_back(bodyId);
							ext.push_back(bodies_[bodyId].get_pred_idx(a->id()));
							assert(bodies_[bodyId].get_pred(ext.back()) == a->id());
							prop |= AtomNode::property_in_ext;
						}
					}
				}
			}
			if (!ext.empty()) {
				adj.push_back(idMax);
				adj.insert(adj.end(), ext.begin(), ext.end());
			}
			adj.push_back(idMax);
			initAtom(a->id(), prop, adj, nPred);
			adj.clear(); ext.clear();
		}
	}
	if (nonHcfs.size() != 0 && stats_ == 0 && nonHcfs.config && nonHcfs.config->context().stats) {
		stats_ = enableNonHcfStats(nonHcfs.config->context().stats, prg.isIncremental());
	}
	// "update" existing non-hcf components
	for (NonHcfIter it = nonHcfBegin(), end = nonHcfEnd(); it != end; ++it) {
		(*it)->update(ctx);
	}
	// add new non-hcf components
	uint32 hcc = seenComponents_;
	for (NonHcfSet::const_iterator it = nonHcfs.begin() + seenComponents_, end = nonHcfs.end(); it != end; ++it, ++hcc) {
		addNonHcf(hcc, ctx, nonHcfs.config, *it);
	}
	seenComponents_ = nonHcfs.size();
}